

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook_test.cc
# Opt level: O1

void __thiscall
HookListTest_AddAppends_Test::~HookListTest_AddAppends_Test(HookListTest_AddAppends_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HookListTest, AddAppends) {
  TestHookList list{kTestValue};
  ASSERT_TRUE(list.Add(kAnotherTestValue));
  EXPECT_EQ(2, list.priv_end);

  MallocHook::NewHook values[2] = {};
  EXPECT_EQ(2, list.Traverse(values, 2));
  EXPECT_EQ(kTestValue, values[0]);
  EXPECT_EQ(kAnotherTestValue, values[1]);
}